

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O2

int ef_order(void *ap,void *bp)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ef *b;
  ef *a;
  
  uVar2 = (uint)*(ushort *)((long)ap + 8);
  uVar4 = (uint)*(ushort *)((long)bp + 8);
  if (*(ushort *)((long)ap + 8) == *(ushort *)((long)bp + 8)) {
    uVar2 = (uint)*(ushort *)((long)ap + 10);
    uVar4 = (uint)*(ushort *)((long)bp + 10);
    if (*(ushort *)((long)ap + 10) == *(ushort *)((long)bp + 10)) {
      uVar1 = *(ushort *)((long)ap + 0xc);
      uVar2 = (uint)uVar1;
      uVar4 = (uint)*(ushort *)((long)bp + 0xc);
      if (uVar1 == *(ushort *)((long)bp + 0xc)) {
        iVar3 = memcmp(*(void **)((long)ap + 0x10),*(void **)((long)bp + 0x10),(ulong)uVar1);
        return iVar3;
      }
    }
  }
  return uVar2 - uVar4;
}

Assistant:

static int
ef_order(const void *ap, const void *bp) {
    const struct ef *a, *b;

    a = (struct ef *)ap;
    b = (struct ef *)bp;

    if (a->flags != b->flags)
	return a->flags - b->flags;
    if (a->id != b->id)
	return a->id - b->id;
    if (a->size != b->size)
	return a->size - b->size;
    return memcmp(a->data, b->data, a->size);
}